

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_iTXt(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  png_uint_32 pVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint prefix_size;
  bool bVar5;
  bool bVar6;
  undefined1 local_80 [8];
  png_text text;
  png_alloc_size_t uncompressed_length;
  png_uint_32 translated_keyword_offset;
  png_uint_32 language_offset;
  int compressed;
  png_uint_32 prefix_length;
  png_bytep buffer;
  png_const_charp errmsg;
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  buffer = (png_bytep)0x0;
  if (png_ptr->user_chunk_cache_max != 0) {
    if (png_ptr->user_chunk_cache_max == 1) {
      png_crc_finish(png_ptr,length);
      return;
    }
    pVar1 = png_ptr->user_chunk_cache_max - 1;
    png_ptr->user_chunk_cache_max = pVar1;
    if (pVar1 == 1) {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error(png_ptr,"no space in chunk cache");
      return;
    }
  }
  if ((png_ptr->mode & 1) != 0) {
    if ((png_ptr->mode & 4) != 0) {
      png_ptr->mode = png_ptr->mode | 8;
    }
    _compressed = png_read_buffer(png_ptr,(ulong)(length + 1),1);
    if (_compressed == (png_bytep)0x0) {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error(png_ptr,"out of memory");
    }
    else {
      png_crc_read(png_ptr,_compressed,length);
      iVar2 = png_crc_finish(png_ptr,0);
      if (iVar2 == 0) {
        language_offset = 0;
        while( true ) {
          bVar5 = false;
          if (language_offset < length) {
            bVar5 = _compressed[language_offset] != '\0';
          }
          if (!bVar5) break;
          language_offset = language_offset + 1;
        }
        if ((language_offset < 0x50) && (language_offset != 0)) {
          if (length < language_offset + 5) {
            buffer = "truncated";
          }
          else if ((_compressed[language_offset + 1] == '\0') ||
                  ((_compressed[language_offset + 1] == '\x01' &&
                   (_compressed[language_offset + 2] == '\0')))) {
            bVar5 = _compressed[language_offset + 1] != '\0';
            text.lang_key = (png_charp)0x0;
            uVar3 = language_offset + 3;
            language_offset = uVar3;
            while( true ) {
              bVar6 = false;
              if (language_offset < length) {
                bVar6 = _compressed[language_offset] != '\0';
              }
              if (!bVar6) break;
              language_offset = language_offset + 1;
            }
            uVar4 = language_offset + 1;
            language_offset = uVar4;
            while( true ) {
              bVar6 = false;
              if (language_offset < length) {
                bVar6 = _compressed[language_offset] != '\0';
              }
              if (!bVar6) break;
              language_offset = language_offset + 1;
            }
            prefix_size = language_offset + 1;
            if ((bVar5) || (length < prefix_size)) {
              if ((bVar5) && (prefix_size < length)) {
                text.lang_key = (png_charp)0xffffffffffffffff;
                iVar2 = png_decompress_chunk
                                  (png_ptr,length,prefix_size,(png_alloc_size_t *)&text.lang_key,1);
                if (iVar2 == 1) {
                  _compressed = png_ptr->read_buffer;
                }
                else {
                  buffer = (png_bytep)(png_ptr->zstream).msg;
                }
              }
              else {
                buffer = "truncated";
              }
            }
            else {
              text.lang_key = (png_charp)(ulong)(length - prefix_size);
            }
            if (buffer == (png_bytep)0x0) {
              _compressed[(long)(text.lang_key + prefix_size)] = '\0';
              if (bVar5) {
                local_80._0_4_ = 2;
              }
              else {
                local_80._0_4_ = 1;
              }
              text._0_8_ = _compressed;
              text.itxt_length = (png_size_t)(_compressed + uVar3);
              text.lang = (png_charp)(_compressed + uVar4);
              text.key = (png_charp)(_compressed + prefix_size);
              text.text = (png_charp)0x0;
              text.text_length = (png_size_t)text.lang_key;
              iVar2 = png_set_text_2(png_ptr,info_ptr,(png_const_textp)local_80,1);
              if (iVar2 != 0) {
                buffer = "insufficient memory";
              }
            }
          }
          else {
            buffer = "bad compression info";
          }
        }
        else {
          buffer = "bad keyword";
        }
        if (buffer != (png_bytep)0x0) {
          png_chunk_benign_error(png_ptr,(png_const_charp)buffer);
        }
      }
    }
    return;
  }
  png_chunk_error(png_ptr,"missing IHDR");
}

Assistant:

void /* PRIVATE */
png_handle_iTXt(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_const_charp errmsg = NULL;
   png_bytep buffer;
   png_uint_32 prefix_length;

   png_debug(1, "in png_handle_iTXt");

#ifdef PNG_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_cache_max != 0)
   {
      if (png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         return;
      }

      if (--png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "no space in chunk cache");
         return;
      }
   }
#endif

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
      png_ptr->mode |= PNG_AFTER_IDAT;

   buffer = png_read_buffer(png_ptr, length+1, 1/*warn*/);

   if (buffer == NULL)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of memory");
      return;
   }

   png_crc_read(png_ptr, buffer, length);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   /* First the keyword. */
   for (prefix_length=0;
      prefix_length < length && buffer[prefix_length] != 0;
      ++prefix_length)
      /* Empty loop */ ;

   /* Perform a basic check on the keyword length here. */
   if (prefix_length > 79 || prefix_length < 1)
      errmsg = "bad keyword";

   /* Expect keyword, compression flag, compression type, language, translated
    * keyword (both may be empty but are 0 terminated) then the text, which may
    * be empty.
    */
   else if (prefix_length + 5 > length)
      errmsg = "truncated";

   else if (buffer[prefix_length+1] == 0 ||
      (buffer[prefix_length+1] == 1 &&
      buffer[prefix_length+2] == PNG_COMPRESSION_TYPE_BASE))
   {
      int compressed = buffer[prefix_length+1] != 0;
      png_uint_32 language_offset, translated_keyword_offset;
      png_alloc_size_t uncompressed_length = 0;

      /* Now the language tag */
      prefix_length += 3;
      language_offset = prefix_length;

      for (; prefix_length < length && buffer[prefix_length] != 0;
         ++prefix_length)
         /* Empty loop */ ;

      /* WARNING: the length may be invalid here, this is checked below. */
      translated_keyword_offset = ++prefix_length;

      for (; prefix_length < length && buffer[prefix_length] != 0;
         ++prefix_length)
         /* Empty loop */ ;

      /* prefix_length should now be at the trailing '\0' of the translated
       * keyword, but it may already be over the end.  None of this arithmetic
       * can overflow because chunks are at most 2^31 bytes long, but on 16-bit
       * systems the available allocation may overflow.
       */
      ++prefix_length;

      if (compressed == 0 && prefix_length <= length)
         uncompressed_length = length - prefix_length;

      else if (compressed != 0 && prefix_length < length)
      {
         uncompressed_length = PNG_SIZE_MAX;

         /* TODO: at present png_decompress_chunk imposes a single application
          * level memory limit, this should be split to different values for
          * iCCP and text chunks.
          */
         if (png_decompress_chunk(png_ptr, length, prefix_length,
             &uncompressed_length, 1/*terminate*/) == Z_STREAM_END)
            buffer = png_ptr->read_buffer;

         else
            errmsg = png_ptr->zstream.msg;
      }

      else
         errmsg = "truncated";

      if (errmsg == NULL)
      {
         png_text text;

         buffer[uncompressed_length+prefix_length] = 0;

         if (compressed == 0)
            text.compression = PNG_ITXT_COMPRESSION_NONE;

         else
            text.compression = PNG_ITXT_COMPRESSION_zTXt;

         text.key = (png_charp)buffer;
         text.lang = (png_charp)buffer + language_offset;
         text.lang_key = (png_charp)buffer + translated_keyword_offset;
         text.text = (png_charp)buffer + prefix_length;
         text.text_length = 0;
         text.itxt_length = uncompressed_length;

         if (png_set_text_2(png_ptr, info_ptr, &text, 1) != 0)
            errmsg = "insufficient memory";
      }
   }

   else
      errmsg = "bad compression info";

   if (errmsg != NULL)
      png_chunk_benign_error(png_ptr, errmsg);
}